

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall LINSimulationDataGenerator::CreateBadFrame(LINSimulationDataGenerator *this)

{
  double *pdVar1;
  byte bVar2;
  U8 UVar3;
  int iVar4;
  char cVar5;
  
  rand();
  SimulationChannelDescriptor::Advance((int)this + 0x10);
  bVar2 = CreateHeader(this);
  if (((bVar2 & 0xfe) == 0x3c) ||
     (pdVar1 = &this->mSettings->mLINVersion, *pdVar1 <= 2.0 && *pdVar1 != 2.0)) {
    LINChecksum::clear(&this->mChecksum);
  }
  rand();
  cVar5 = '\x05';
  do {
    iVar4 = rand();
    CreateSerialByte(this,(U8)iVar4);
    cVar5 = cVar5 + -1;
  } while (cVar5 != '\0');
  UVar3 = LINChecksum::result(&this->mChecksum);
  CreateSerialByte(this,UVar3 + '\x03');
  return;
}

Assistant:

void LINSimulationDataGenerator::CreateBadFrame()
{
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;
    mSerialSimulationData.Advance( samples_per_bit * Random( 1, 4 ) ); // simulate jitter
    U8 identifier = CreateHeader();
    bool classic_identifier = false;
    if( identifier == 0x3C || identifier == 0x3D )
        classic_identifier = true;

    if( mSettings->mLINVersion < 2 || classic_identifier == true )
        mChecksum.clear(); // Version 1 starts chksum at first data byte.
    U32 data_count = Random( 1, 8 );

    data_count = 5;
    for( U8 i = 0; i < data_count && i < 8; i++ )
    {
        CreateSerialByte( static_cast<U8>( Random( 0, 255 ) & 0xFF ) );
    }
    CreateSerialByte( mChecksum.result() + 3 );
}